

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_buffer_method_put(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  uint uVar5;
  TRef *pTVar6;
  IRRef1 IVar7;
  long lVar8;
  IRRef1 IVar9;
  
  TVar2 = recff_sbufx_check(J,rd,0);
  TVar3 = recff_sbufx_write(J,TVar2);
  pTVar6 = J->base;
  if (pTVar6[1] == 0) {
    return;
  }
  for (lVar8 = 1; pTVar6[lVar8] != 0; lVar8 = lVar8 + 1) {
    if ((pTVar6[lVar8] & 0x1f000000) == 0xc000000) {
      TVar4 = recff_sbufx_check(J,rd,lVar8);
      (J->fold).ins.field_0.ot = 0x989;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
      pTVar6 = J->base;
    }
  }
  lVar8 = 4;
  do {
    uVar1 = *(uint *)((long)pTVar6 + lVar8);
    IVar7 = (IRRef1)TVar3;
    if (uVar1 == 0) {
      (J->fold).ins.field_0.op1 = IVar7;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x12000000;
      lj_opt_fold(J);
      return;
    }
    uVar5 = uVar1 & 0x1f000000;
    IVar9 = (IRRef1)uVar1;
    if (uVar5 == 0x4000000) {
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = IVar7;
      (J->fold).ins.field_0.op2 = IVar9;
LAB_001504f4:
      TVar3 = lj_opt_fold(J);
    }
    else {
      if ((uVar1 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = IVar9;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)(uVar5 == 0xe000000);
        TVar2 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5689;
        (J->fold).ins.field_0.op1 = IVar7;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        goto LAB_001504f4;
      }
      if (uVar5 == 0xc000000) {
        (J->fold).ins.field_0.op1 = IVar9;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090013;
        TVar2 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = IVar9;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar4 = lj_opt_fold(J);
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
        TVar4 = lj_opt_fold(J);
        TVar3 = lj_ir_call(J,IRCALL_lj_buf_putmem,(ulong)TVar3,(ulong)TVar2,(ulong)TVar4);
      }
      else {
        recff_nyi(J,rd);
      }
    }
    pTVar6 = J->base;
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_buffer_method_put(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trbuf = recff_sbufx_write(J, ud);
  TRef tr;
  ptrdiff_t arg;
  if (!J->base[1]) return;
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isudata(tr)) {
      TRef ud2 = recff_sbufx_check(J, rd, arg);
      emitir(IRTG(IR_NE, IRT_PGC), ud, ud2);
    }
  }
  for (arg = 1; (tr = J->base[arg]); arg++) {
    if (tref_isstr(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf, tr);
    } else if (tref_isnumber(tr)) {
      trbuf = emitir(IRTG(IR_BUFPUT, IRT_PGC), trbuf,
		     emitir(IRT(IR_TOSTR, IRT_STR), tr,
			    tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT));
    } else if (tref_isudata(tr)) {
      TRef trr = recff_sbufx_get_ptr(J, tr, IRFL_SBUF_R);
      TRef trw = recff_sbufx_get_ptr(J, tr, IRFL_SBUF_W);
      TRef len = recff_sbufx_len(J, trr, trw);
      trbuf = lj_ir_call(J, IRCALL_lj_buf_putmem, trbuf, trr, len);
    } else {
      recff_nyiu(J, rd);
    }
  }
  emitir(IRT(IR_USE, IRT_NIL), trbuf, 0);
}